

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

vector<poly,_std::allocator<poly>_> * __thiscall
matrix::rref_nullspace
          (vector<poly,_std::allocator<poly>_> *__return_storage_ptr__,matrix *this,
          vector<int,_std::allocator<int>_> *piv)

{
  undefined4 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  ulong local_90;
  size_t i;
  undefined1 local_78 [8];
  poly p;
  ulong uStack_30;
  int j;
  size_t k;
  vector<int,_std::allocator<int>_> *piv_local;
  matrix *this_local;
  vector<poly,_std::allocator<poly>_> *ret;
  
  std::__debug::vector<poly,_std::allocator<poly>_>::vector(__return_storage_ptr__);
  uStack_30 = 0;
  for (p._60_4_ = 0; (int)p._60_4_ < this->ncols; p._60_4_ = p._60_4_ + 1) {
    sVar3 = std::__cxx1998::vector<int,_std::allocator<int>_>::size
                      (&piv->super_vector<int,_std::allocator<int>_>);
    uVar1 = p._60_4_;
    if ((uStack_30 < sVar3) &&
       (pvVar4 = std::__debug::vector<int,_std::allocator<int>_>::operator[](piv,uStack_30),
       uVar1 == *pvVar4)) {
      uStack_30 = uStack_30 + 1;
    }
    else {
      pvVar5 = std::__debug::vector<poly,_std::allocator<poly>_>::operator[](&this->rows,0);
      iVar2 = poly::bits(pvVar5);
      poly::poly((poly *)local_78,(long)iVar2);
      poly::xor_bit((poly *)local_78,p._60_4_,1);
      for (local_90 = 0;
          sVar3 = std::__cxx1998::vector<int,_std::allocator<int>_>::size
                            (&piv->super_vector<int,_std::allocator<int>_>), local_90 < sVar3;
          local_90 = local_90 + 1) {
        pvVar5 = std::__debug::vector<poly,_std::allocator<poly>_>::operator[](&this->rows,local_90)
        ;
        iVar2 = poly::operator[](pvVar5,p._60_4_);
        if (iVar2 != 0) {
          pvVar4 = std::__debug::vector<int,_std::allocator<int>_>::operator[](piv,local_90);
          poly::xor_bit((poly *)local_78,*pvVar4,1);
        }
      }
      std::__debug::vector<poly,_std::allocator<poly>_>::push_back
                (__return_storage_ptr__,(poly *)local_78);
      poly::~poly((poly *)local_78);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<poly> matrix::rref_nullspace(const std::vector<int> &piv) const {
    std::vector<poly> ret;
    size_t k = 0;
    for (int j = 0; j < ncols; j++) {
        if (k < piv.size() && j == piv[k]) {
            k++;
            continue;
        }
        poly p(rows[0].bits());
        p.xor_bit(j, 1);
        for (size_t i = 0; i < piv.size(); i++)
            if (rows[i][j])
                p.xor_bit(piv[i], 1);
        ret.push_back(p);
    }
    return ret;
}